

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O3

bool __thiscall QHstsHeaderParser::parseSTSHeader(QHstsHeaderParser *this)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QDateTime::QDateTime((QDateTime *)&local_38);
  pcVar1 = *(char **)&this->expiry;
  *(char **)&this->expiry = local_38;
  local_38 = pcVar1;
  QDateTime::~QDateTime((QDateTime *)&local_38);
  this->maxAgeFound = false;
  this->subDomainsFound = false;
  this->maxAge = 0;
  this->tokenPos = 0;
  QByteArray::clear();
  bVar3 = true;
  if ((long)this->tokenPos < (this->header).d.size) {
    do {
      bVar2 = parseDirective(this);
      if (!bVar2) {
LAB_001739e4:
        bVar3 = false;
        break;
      }
      if ((this->token).d.size != 0) {
        local_38 = ";";
        bVar2 = operator!=(&this->token,&local_38);
        if (bVar2) goto LAB_001739e4;
      }
    } while ((long)this->tokenPos < (this->header).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QHstsHeaderParser::parseSTSHeader()
{
    expiry = QDateTime();
    maxAgeFound = false;
    subDomainsFound = false;
    maxAge = 0;
    tokenPos = 0;
    token.clear();

    while (tokenPos < header.size()) {
        if (!parseDirective())
            return false;

        if (token.size() && token != ";") {
            // After a directive we can only have a ";" or no more tokens.
            // Invalid syntax.
            return false;
        }
    }

    return true;
}